

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O0

bool dxil_spv::analyze_magic_ags_instruction(Impl *impl)

{
  undefined8 uVar1;
  undefined8 uVar2;
  CallInst *pCVar3;
  CallInst *pCVar4;
  CallInst *pCVar5;
  CallInst *pCVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  CallInst **ppCVar17;
  AgsInstruction *pAVar18;
  bool bVar19;
  uint32_t local_28;
  uint opcode;
  uint32_t output_immediate;
  uint32_t phase;
  Id type_id;
  bool has_wmma_return_values;
  Impl *impl_local;
  
  if ((impl->ags).num_instructions == 0) {
    impl_local._7_1_ = true;
  }
  else {
    phase._3_1_ = 0;
    output_immediate = 0;
    opcode = 0;
    _type_id = impl;
    switch((impl->ags).instructions[0].opcode) {
    case 0x28:
      phase._3_1_ = (impl->ags).num_instructions == 0x15;
      if ((bool)phase._3_1_) {
        output_immediate =
             get_matmul_result_type(impl,(impl->ags).instructions[0xc].immediate & 0x7f);
        opcode = 2;
      }
      break;
    case 0x29:
    case 0x2d:
      phase._3_1_ = (impl->ags).num_instructions == 10;
      if ((bool)phase._3_1_) {
        output_immediate = build_coopmat_type(impl,(impl->ags).instructions[1].immediate);
        opcode = 2;
      }
      break;
    default:
      break;
    case 0x2f:
      phase._3_1_ = (impl->ags).num_instructions == 0xd;
      if ((bool)phase._3_1_) {
        output_immediate = build_coopmat_type(impl,(impl->ags).instructions[4].immediate);
        opcode = 2;
      }
      break;
    case 0x32:
      if (((impl->ags).current_phase == 1) && (5 < (impl->ags).num_instructions)) {
        pAVar18 = (impl->ags).instructions + ((impl->ags).num_instructions - 5);
        uVar15 = pAVar18->opcode;
        uVar16 = pAVar18->phase;
        uVar1 = *(undefined8 *)&pAVar18->immediate;
        uVar11 = pAVar18[1].phase;
        uVar12 = pAVar18[1].immediate;
        uVar13 = pAVar18[2].opcode;
        uVar14 = pAVar18[2].phase;
        uVar2 = *(undefined8 *)&pAVar18[2].immediate;
        uVar9 = pAVar18[3].phase;
        uVar10 = pAVar18[3].immediate;
        uVar7 = pAVar18[4].opcode;
        uVar8 = pAVar18[4].phase;
        (impl->ags).instructions[4].immediate = pAVar18[4].immediate;
        (impl->ags).instructions[4].opcode = uVar7;
        (impl->ags).instructions[4].phase = uVar8;
        *(undefined8 *)&(impl->ags).instructions[2].immediate = uVar2;
        (impl->ags).instructions[3].phase = uVar9;
        (impl->ags).instructions[3].immediate = uVar10;
        (impl->ags).instructions[1].phase = uVar11;
        (impl->ags).instructions[1].immediate = uVar12;
        (impl->ags).instructions[2].opcode = uVar13;
        (impl->ags).instructions[2].phase = uVar14;
        (impl->ags).instructions[0].opcode = uVar15;
        (impl->ags).instructions[0].phase = uVar16;
        *(undefined8 *)&(impl->ags).instructions[0].immediate = uVar1;
        ppCVar17 = (impl->ags).backdoor_instructions + ((impl->ags).num_instructions - 5);
        pCVar3 = *ppCVar17;
        pCVar4 = ppCVar17[1];
        pCVar5 = ppCVar17[2];
        pCVar6 = ppCVar17[3];
        (impl->ags).backdoor_instructions[4] = ppCVar17[4];
        (impl->ags).backdoor_instructions[2] = pCVar5;
        (impl->ags).backdoor_instructions[3] = pCVar6;
        (impl->ags).backdoor_instructions[0] = pCVar3;
        (impl->ags).backdoor_instructions[1] = pCVar4;
        (impl->ags).num_instructions = 5;
      }
      phase._3_1_ = (impl->ags).num_instructions == 0xd;
      if ((bool)phase._3_1_) {
        local_28 = 0;
        bVar19 = get_constant_operand
                           (&(impl->ags).backdoor_instructions[4]->super_Instruction,5,&local_28);
        if (!bVar19) {
          return false;
        }
        output_immediate = build_coopmat_type(_type_id,local_28);
        opcode = 2;
      }
      break;
    case 0x33:
      bVar19 = (impl->ags).num_instructions == 9;
      phase._3_1_ = bVar19;
      if (bVar19) {
        output_immediate = build_coopmat_type(impl,(impl->ags).instructions[0].immediate);
      }
      opcode = (uint)bVar19;
    }
    if ((phase._3_1_ & 1) == 0) {
      impl_local._7_1_ = true;
    }
    else {
      impl_local._7_1_ = emit_wmma_return_values(_type_id,output_immediate,0,opcode);
    }
  }
  return impl_local._7_1_;
}

Assistant:

bool analyze_magic_ags_instruction(Converter::Impl &impl)
{
	if (impl.ags.num_instructions == 0)
		return true;

	bool has_wmma_return_values = false;
	spv::Id type_id = 0;
	uint32_t phase = 0;

	switch (impl.ags.instructions[0].opcode)
	{
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixUavLoad:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixLdsLoad:
		has_wmma_return_values = impl.ags.num_instructions == 10;
		if (has_wmma_return_values)
		{
			type_id = build_coopmat_type(impl, impl.ags.instructions[1].immediate);
			phase = 2;
		}
		break;

	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixCopy:
		if (impl.ags.current_phase == 1)
		{
			if (impl.ags.num_instructions > 5)
			{
				// Apparently some shaders encode dummy inputs? Shift away useless stuff either way.
				memmove(impl.ags.instructions, impl.ags.instructions + (impl.ags.num_instructions - 5),
				        5 * sizeof(impl.ags.instructions[0]));
				memmove(impl.ags.backdoor_instructions, impl.ags.backdoor_instructions + (impl.ags.num_instructions - 5),
				        5 * sizeof(impl.ags.backdoor_instructions[0]));
				impl.ags.num_instructions = 5;
			}
		}
		has_wmma_return_values = impl.ags.num_instructions == 13;
		if (has_wmma_return_values)
		{
			uint32_t output_immediate = 0;
			if (!get_constant_operand(impl.ags.backdoor_instructions[4], 5, &output_immediate))
				return false;
			type_id = build_coopmat_type(impl, output_immediate);
			phase = 2;
		}
		break;

	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixMulAcc:
		has_wmma_return_values = impl.ags.num_instructions == 21;
		if (has_wmma_return_values)
		{
			auto opcode = (impl.ags.instructions[12].immediate >> AmdExtD3DShaderIntrinsicsWaveMatrixOpcode_OpsShift) &
			              AmdExtD3DShaderIntrinsicsWaveMatrixOpcode_OpsMask;
			type_id = get_matmul_result_type(impl, opcode);
			phase = 2;
		}
		break;

	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixFill:
		has_wmma_return_values = impl.ags.num_instructions == 9;
		if (has_wmma_return_values)
		{
			type_id = build_coopmat_type(impl, impl.ags.instructions[0].immediate);
			phase = 1;
		}
		break;

	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixElementFill:
		 has_wmma_return_values = impl.ags.num_instructions == 13;
		 if (has_wmma_return_values)
		 {
			 type_id = build_coopmat_type(impl, impl.ags.instructions[4].immediate);
			 phase = 2;
		 }
		 break;

	default:
		break;
	}

	if (has_wmma_return_values)
		return emit_wmma_return_values(impl, type_id, 0, phase);
	else
		return true;
}